

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::ChangeValueType
          (GlobOpt *this,BasicBlock *block,Value *value,ValueType newValueType,
          bool preserveSubclassInfo,bool allowIncompatibleType)

{
  code *pcVar1;
  bool bVar2;
  ObjectType OVar3;
  ObjectType OVar4;
  undefined4 *puVar5;
  ValueInfo *this_00;
  anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *paVar6;
  Sym *pSVar7;
  StackSym *this_01;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar8;
  ValueInfo *local_60;
  ValueInfo *newValueInfo;
  ValueInfo *pVStack_38;
  ValueType valueType;
  ValueInfo *valueInfo;
  bool allowIncompatibleType_local;
  bool preserveSubclassInfo_local;
  Value *value_local;
  BasicBlock *block_local;
  GlobOpt *this_local;
  ValueType newValueType_local;
  
  this_local._6_2_ = newValueType.field_0;
  if (value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3178,"(value)","value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_00 = ::Value::GetValueInfo(value);
  bVar2 = ValueInfo::IsJsType(this_00);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x317a,"(!value->GetValueInfo()->IsJsType())",
                       "!value->GetValueInfo()->IsJsType()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pVStack_38 = ::Value::GetValueInfo(value);
  paVar6 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
           ValueInfo::Type(pVStack_38);
  newValueInfo._6_2_ = *paVar6;
  newValueInfo._4_2_ = this_local._6_2_;
  bVar2 = ValueType::operator==((ValueType *)((long)&newValueInfo + 6),(ValueType)this_local._6_2_);
  if (bVar2) {
    if (preserveSubclassInfo) {
      return;
    }
    bVar2 = ValueInfo::IsGeneric(pVStack_38);
    if (bVar2) {
      return;
    }
  }
  if ((preserveSubclassInfo) && (bVar2 = ValueInfo::IsArrayValueInfo(pVStack_38), bVar2)) {
    bVar2 = ValueType::IsObject((ValueType *)((long)&this_local + 6));
    if (bVar2) {
      OVar3 = ValueType::GetObjectType((ValueType *)((long)&this_local + 6));
      OVar4 = ValueType::GetObjectType(&pVStack_38->super_ValueType);
      if (OVar3 == OVar4) goto LAB_0058b773;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3187,
                       "(!preserveSubclassInfo || !valueInfo->IsArrayValueInfo() || newValueType.IsObject() && newValueType.GetObjectType() == valueInfo->GetObjectType())"
                       ,
                       "!preserveSubclassInfo || !valueInfo->IsArrayValueInfo() || newValueType.IsObject() && newValueType.GetObjectType() == valueInfo->GetObjectType()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
LAB_0058b773:
  pSVar7 = ValueInfo::GetSymStore(pVStack_38);
  if (pSVar7 != (Sym *)0x0) {
    pSVar7 = ValueInfo::GetSymStore(pVStack_38);
    bVar2 = Sym::IsStackSym(pSVar7);
    if (bVar2) {
      pSVar7 = ValueInfo::GetSymStore(pVStack_38);
      this_01 = Sym::AsStackSym(pSVar7);
      bVar2 = StackSym::IsFromByteCodeConstantTable(this_01);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3189,
                           "(!valueInfo->GetSymStore() || !valueInfo->GetSymStore()->IsStackSym() || !valueInfo->GetSymStore()->AsStackSym()->IsFromByteCodeConstantTable())"
                           ,
                           "!valueInfo->GetSymStore() || !valueInfo->GetSymStore()->IsStackSym() || !valueInfo->GetSymStore()->AsStackSym()->IsFromByteCodeConstantTable()"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
  }
  if (preserveSubclassInfo) {
    local_60 = ValueInfo::Copy(pVStack_38,this->alloc);
  }
  else {
    local_60 = ValueInfo::CopyWithGenericStructureKind(pVStack_38,this->alloc);
  }
  paVar8 = &ValueInfo::Type(local_60)->field_0;
  *paVar8 = this_local._6_2_;
  ChangeValueInfo(this,block,value,local_60,allowIncompatibleType,false);
  return;
}

Assistant:

void
GlobOpt::ChangeValueType(
    BasicBlock *const block,
    Value *const value,
    const ValueType newValueType,
    const bool preserveSubclassInfo,
    const bool allowIncompatibleType) const
{
    Assert(value);
    // Why are we trying to change the value type of the type sym value? Asserting here to make sure we don't deep copy the type sym's value info.
    Assert(!value->GetValueInfo()->IsJsType());

    ValueInfo *const valueInfo = value->GetValueInfo();
    const ValueType valueType(valueInfo->Type());
    if(valueType == newValueType && (preserveSubclassInfo || valueInfo->IsGeneric()))
    {
        return;
    }

    // ArrayValueInfo has information specific to the array type, so make sure that doesn't change
    Assert(
        !preserveSubclassInfo ||
        !valueInfo->IsArrayValueInfo() ||
        newValueType.IsObject() && newValueType.GetObjectType() == valueInfo->GetObjectType());

    Assert(!valueInfo->GetSymStore() || !valueInfo->GetSymStore()->IsStackSym() || !valueInfo->GetSymStore()->AsStackSym()->IsFromByteCodeConstantTable());

    ValueInfo *const newValueInfo =
        preserveSubclassInfo
            ? valueInfo->Copy(alloc)
            : valueInfo->CopyWithGenericStructureKind(alloc);
    newValueInfo->Type() = newValueType;
    ChangeValueInfo(block, value, newValueInfo, allowIncompatibleType);
}